

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O2

void __thiscall SQInstance::Mark(SQInstance *this,SQCollectable **chain)

{
  ulong uVar1;
  SQUnsignedInteger SVar2;
  SQObjectPtr *o;
  bool bVar3;
  
  uVar1 = (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  if (-1 < (int)uVar1) {
    (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = uVar1 | 0x80000000;
    (*(this->_class->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[4])();
    SVar2 = (this->_class->_defaultvalues)._size;
    o = this->_values;
    while (bVar3 = SVar2 != 0, SVar2 = SVar2 - 1, bVar3) {
      SQSharedState::MarkObject(o,(SQCollectable_conflict **)chain);
      o = o + 1;
    }
    SQCollectable::RemoveFromChain
              (&((this->super_SQDelegable).super_SQCollectable._sharedstate)->_gc_chain,
               (SQCollectable_conflict *)this);
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
    return;
  }
  return;
}

Assistant:

void SQInstance::Mark(SQCollectable **chain)
{
    START_MARK()
        _class->Mark(chain);
        SQUnsignedInteger nvalues = _class->_defaultvalues.size();
        for(SQUnsignedInteger i =0; i< nvalues; i++) {
            SQSharedState::MarkObject(_values[i], chain);
        }
    END_MARK()
}